

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::IntegerLiteralTypeInfo::Deserialize(IntegerLiteralTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  IntegerLiteralTypeInfo *pIVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::IntegerLiteralTypeInfo,_true> result;
  
  pIVar2 = (IntegerLiteralTypeInfo *)operator_new(0x78);
  IntegerLiteralTypeInfo(pIVar2);
  ::std::__shared_ptr<duckdb::IntegerLiteralTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::IntegerLiteralTypeInfo,void>
            ((__shared_ptr<duckdb::IntegerLiteralTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,
             pIVar2);
  pIVar2 = shared_ptr<duckdb::IntegerLiteralTypeInfo,_true>::operator->(&result);
  Deserializer::ReadProperty<duckdb::Value>
            (deserializer,200,"constant_value",&pIVar2->constant_value);
  _Var1 = result.internal.
          super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  result.internal.super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.
       super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.
              super___shared_ptr<duckdb::IntegerLiteralTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> IntegerLiteralTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<IntegerLiteralTypeInfo>(new IntegerLiteralTypeInfo());
	deserializer.ReadProperty<Value>(200, "constant_value", result->constant_value);
	return std::move(result);
}